

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

string * __thiscall
license::FullLicenseInfo::printForSign_abi_cxx11_
          (string *__return_storage_ptr__,FullLicenseInfo *this)

{
  ostream *poVar1;
  ostringstream oss;
  string sStack_1c8;
  string local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  trim_copy(&local_1a8,&this->product);
  toupper_copy(&sStack_1c8,&local_1a8);
  std::operator<<((ostream *)local_188,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::ostream::operator<<((ostream *)local_188,0x17f);
  if (this->has_client_sig == true) {
    trim_copy(&sStack_1c8,&this->client_signature);
    std::operator<<((ostream *)local_188,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
  }
  if (this->has_versions == true) {
    poVar1 = std::operator<<((ostream *)local_188,"|");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"-");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (this->has_expiry == true) {
    poVar1 = std::operator<<((ostream *)local_188,"|");
    poVar1 = std::operator<<(poVar1,(string *)&this->from_date);
    poVar1 = std::operator<<(poVar1,"|");
    std::operator<<(poVar1,(string *)&this->to_date);
  }
  if ((this->extra_data)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)local_188,"|");
    std::operator<<(poVar1,(string *)&this->extra_data);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

string FullLicenseInfo::printForSign() const {
	ostringstream oss;
	oss << toupper_copy(trim_copy(this->product));
	oss << SHARED_RANDOM
	;
	if (has_client_sig) {
		oss << trim_copy(this->client_signature);
	}
	if (has_versions) {
		oss << "|" << this->from_sw_version << "-" << this->to_sw_version;
	}
	if (has_expiry) {
		oss << "|" << this->from_date << "|" << this->to_date;
	}
	if (this->extra_data.length() > 0) {
		oss << "|" << extra_data;
	}
#ifdef _DEBUG
	cout << "[" << oss.str() << "]" << endl;
#endif
	return oss.str();

}